

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

int jx9Builtin_explode(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  int iVar1;
  sxi32 sVar2;
  uint uVar3;
  uint local_6c;
  sxi32 rc;
  sxu32 nOfft;
  jx9_value *pValue;
  jx9_value *pArray;
  int local_50;
  int iLimit;
  int nStrlen;
  int nDelim;
  char *zEnd;
  char *zCur;
  char *zString;
  char *zDelim;
  jx9_value **apArg_local;
  jx9_context *pjStack_18;
  int nArg_local;
  jx9_context *pCtx_local;
  
  zDelim = (char *)apArg;
  apArg_local._4_4_ = nArg;
  pjStack_18 = pCtx;
  if (nArg < 2) {
    jx9_result_bool(pCtx,0);
  }
  else {
    zString = jx9_value_to_string(*apArg,&iLimit);
    if (iLimit < 1) {
      jx9_result_bool(pjStack_18,0);
    }
    else {
      zCur = jx9_value_to_string(*(jx9_value **)(zDelim + 8),&local_50);
      if (local_50 < 1) {
        jx9_result_bool(pjStack_18,0);
      }
      else {
        _nStrlen = zCur + local_50;
        pValue = jx9_context_new_array(pjStack_18);
        _rc = jx9_context_new_scalar(pjStack_18);
        if ((pValue == (jx9_value *)0x0) || (_rc == (jx9_value *)0x0)) {
          jx9_result_bool(pjStack_18,0);
        }
        else {
          pArray._4_4_ = 0x7fffffff;
          if (2 < apArg_local._4_4_) {
            pArray._4_4_ = jx9_value_to_int(*(jx9_value **)(zDelim + 0x10));
            if (pArray._4_4_ < 0) {
              pArray._4_4_ = -pArray._4_4_;
            }
            if (pArray._4_4_ == 0) {
              pArray._4_4_ = 1;
            }
            pArray._4_4_ = pArray._4_4_ + -1;
          }
          while (zCur < _nStrlen) {
            sVar2 = SyBlobSearch(zCur,(int)_nStrlen - (int)zCur,zString,iLimit,&local_6c);
            iVar1 = pArray._4_4_;
            if ((sVar2 != 0) || (uVar3 = jx9_array_count(pValue), iVar1 <= (int)uVar3)) {
              if (zCur < _nStrlen) {
                jx9_value_string(_rc,zCur,(int)_nStrlen - (int)zCur);
                jx9_array_add_elem(pValue,(jx9_value *)0x0,_rc);
              }
              break;
            }
            zEnd = zCur + local_6c;
            if (zCur < zEnd) {
              jx9_value_string(_rc,zCur,(int)zEnd - (int)zCur);
              jx9_array_add_elem(pValue,(jx9_value *)0x0,_rc);
            }
            zCur = zEnd + iLimit;
            jx9_value_reset_string_cursor(_rc);
          }
          jx9_result_value(pjStack_18,pValue);
        }
      }
    }
  }
  return 0;
}

Assistant:

static int jx9Builtin_explode(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	const char *zDelim, *zString, *zCur, *zEnd;
	int nDelim, nStrlen, iLimit;
	jx9_value *pArray;
	jx9_value *pValue;
	sxu32 nOfft;
	sxi32 rc;
	if( nArg < 2 ){
		/* Missing arguments, return FALSE */
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	/* Extract the delimiter */
	zDelim = jx9_value_to_string(apArg[0], &nDelim);
	if( nDelim < 1 ){
		/* Empty delimiter, return FALSE */
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	/* Extract the string */
	zString = jx9_value_to_string(apArg[1], &nStrlen);
	if( nStrlen < 1 ){
		/* Empty delimiter, return FALSE */
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	/* Point to the end of the string */
	zEnd = &zString[nStrlen];
	/* Create the array */
	pArray =  jx9_context_new_array(pCtx);
	pValue = jx9_context_new_scalar(pCtx);
	if( pArray == 0 || pValue == 0 ){
		/* Out of memory, return FALSE */
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	/* Set a defualt limit */
	iLimit = SXI32_HIGH;
	if( nArg > 2 ){
		iLimit = jx9_value_to_int(apArg[2]);
		 if( iLimit < 0 ){
			iLimit = -iLimit;
		}
		if( iLimit == 0 ){
			iLimit = 1;
		}
		iLimit--;
	}
	/* Start exploding */
	for(;;){
		if( zString >= zEnd ){
			/* No more entry to process */
			break;
		}
		rc = SyBlobSearch(zString, (sxu32)(zEnd-zString), zDelim, nDelim, &nOfft);
		if( rc != SXRET_OK || iLimit <= (int)jx9_array_count(pArray) ){
			/* Limit reached, insert the rest of the string and break */
			if( zEnd > zString ){
				jx9_value_string(pValue, zString, (int)(zEnd-zString));
				jx9_array_add_elem(pArray, 0/* Automatic index assign*/, pValue);
			}
			break;
		}
		/* Point to the desired offset */
		zCur = &zString[nOfft];
		if( zCur > zString ){
			/* Perform the store operation */
			jx9_value_string(pValue, zString, (int)(zCur-zString));
			jx9_array_add_elem(pArray, 0/* Automatic index assign*/, pValue);
		}
		/* Point beyond the delimiter */
		zString = &zCur[nDelim];
		/* Reset the cursor */
		jx9_value_reset_string_cursor(pValue);
	}
	/* Return the freshly created array */
	jx9_result_value(pCtx, pArray);
	/* NOTE that every allocated jx9_value will be automatically 
	 * released as soon we return from this foregin function.
	 */
	return JX9_OK;
}